

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O3

int __thiscall Vector::remove(Vector *this,char *__filename)

{
  long *plVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (char *)this->vLength;
  if (__filename < pcVar2) {
    pcVar3 = __filename + 1;
    if (pcVar3 < pcVar2) {
      plVar1 = this->vData;
      do {
        plVar1[(long)(pcVar3 + -1)] = plVar1[(long)pcVar3];
        pcVar3 = pcVar3 + 1;
        pcVar2 = (char *)this->vLength;
      } while (pcVar3 < pcVar2);
    }
    pcVar2 = pcVar2 + -1;
    this->vLength = (unsigned_long)pcVar2;
  }
  return (int)pcVar2;
}

Assistant:

void Vector::remove(const unsigned long l) {
  if (l < vLength) {
    for (unsigned long k = l + 1; k < vLength; k++) {
      vData[k - 1] = vData[k];
    }
    vLength--;
  }
}